

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O1

err_t bpkiShareUnwrap(octet *share,size_t *share_len,octet *epki,size_t epki_len,octet *pwd,
                     size_t pwd_len)

{
  byte bVar1;
  byte *pbVar2;
  octet *pki;
  bool_t bVar3;
  err_t eVar4;
  size_t sVar5;
  octet *salt;
  size_t count;
  size_t edata_len;
  size_t iter;
  size_t local_50;
  byte *local_48;
  octet *local_40;
  size_t local_38;
  
  eVar4 = 0x6d;
  if ((((epki_len != 0xffffffffffffffff) &&
       (local_48 = share, bVar3 = memIsValid(epki,epki_len), bVar3 != 0)) &&
      (bVar3 = memIsValid(pwd,pwd_len), bVar3 != 0)) &&
     ((share_len == (size_t *)0x0 || (bVar3 = memIsValid(share_len,8), bVar3 != 0)))) {
    sVar5 = bpkiEdataDec((octet *)0x0,&local_50,(octet *)0x0,(size_t *)0x0,epki,epki_len);
    eVar4 = 0x132;
    if (sVar5 == epki_len) {
      salt = (octet *)blobCreate(local_50 + 0x28);
      if (salt == (octet *)0x0) {
        eVar4 = 0x6e;
      }
      else {
        local_40 = salt + 0x28;
        bpkiEdataDec(local_40,(size_t *)0x0,salt,&local_38,epki,epki_len);
        eVar4 = beltPBKDF2(salt + 8,pwd,pwd_len,local_38,salt,8);
        pki = local_40;
        if ((eVar4 == 0) &&
           (eVar4 = beltKWPUnwrap(local_40,local_40,local_50,(octet *)0x0,salt + 8,0x20),
           pbVar2 = local_48, eVar4 == 0)) {
          count = local_50 - 0x10;
          sVar5 = bpkiShareDec(local_48,&local_50,pki,count);
          eVar4 = 0x132;
          if (sVar5 == count) {
            if (pbVar2 == (byte *)0x0) {
              eVar4 = 0;
            }
            else {
              bVar3 = memIsValid(pbVar2,local_50);
              eVar4 = 0x6d;
              if (bVar3 != 0) {
                eVar4 = 0;
              }
            }
            pbVar2 = local_48;
            if (eVar4 == 0) {
              bpkiShareDec(local_48,share_len,pki,count);
              if (pbVar2 == (byte *)0x0) {
                eVar4 = 0;
              }
              else {
                bVar1 = *pbVar2;
                if (bVar1 == 0) {
                  eVar4 = 0x1fc;
                }
                else {
                  eVar4 = 0x1fc;
                  if (bVar1 < 0x11) {
                    eVar4 = 0;
                  }
                }
              }
            }
          }
        }
        blobClose(salt);
      }
    }
  }
  return eVar4;
}

Assistant:

err_t bpkiShareUnwrap(octet share[], size_t* share_len,
	const octet epki[], size_t epki_len, const octet pwd[], size_t pwd_len)
{
	size_t edata_len, pki_len, count, iter;
	void* state;
	octet* salt;
	octet* key;
	octet* edata;
	err_t code;
	// проверить входные данные
	if (epki_len == SIZE_MAX || !memIsValid(epki, epki_len) ||
		!memIsValid(pwd, pwd_len) ||
		share_len && !memIsValid(share_len, O_PER_S))
		return ERR_BAD_INPUT;
	// определить размер edata
	count = bpkiEdataDec(0, &edata_len, 0, 0, epki, epki_len);
	if (count != epki_len)
		return ERR_BAD_FORMAT;
	// подготовить буферы для параметров PBKDF2
	state = blobCreate(8 + 32 + edata_len);
	if (!state)
		return ERR_OUTOFMEMORY;
	salt = (octet*)state;
	key = salt + 8;
	edata = key + 32;
	// выделить edata
	count = bpkiEdataDec(edata, 0, salt, &iter, epki, epki_len);
	ASSERT(count == epki_len);
	// построить ключ защиты 
	code = beltPBKDF2(key, pwd, pwd_len, iter, salt, 8);
	ERR_CALL_HANDLE(code, blobClose(state));
	// снять защиту
	code = beltKWPUnwrap(edata, edata, edata_len, 0, key, 32);
	ERR_CALL_HANDLE(code, blobClose(state));
	pki_len = edata_len - 16;
	// определить длину share
	count = bpkiShareDec(share, &edata_len, edata, pki_len);
	code = count == pki_len ? ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, blobClose(state));
	// проверить указатель share 
	code = memIsNullOrValid(share, edata_len) ? ERR_OK : ERR_BAD_INPUT;
	ERR_CALL_HANDLE(code, blobClose(state));
	// декодировать pki
	count = bpkiShareDec(share, share_len, edata, pki_len);
	ASSERT(count == pki_len);
	// проверить первый октет share
	code = !share || 1 <= share[0] && share[0] <= 16 ?
		ERR_OK : ERR_BAD_SHAREKEY;
	// завершить
	blobClose(state);
	return code;
}